

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmTarget *target,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  cmTarget *this_01;
  long *plVar2;
  _Base_ptr p_Var3;
  ulong *puVar4;
  _Base_ptr p_Var5;
  string namespacedTarget;
  ulong *local_70;
  long local_68;
  ulong local_60;
  long lStack_58;
  string local_50;
  
  this_00 = target->Makefile;
  this_01 = cmMakefile::FindTargetToUse(this_00,input,false);
  if ((this_01 != (cmTarget *)0x0) && (this_01->IsImportedTarget == false)) {
    p_Var1 = &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var3 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0;
        p_Var5 = (&p_Var5->_M_left)[*(cmTarget **)(p_Var5 + 1) < this_01]) {
      if (*(cmTarget **)(p_Var5 + 1) >= this_01) {
        p_Var3 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
       (p_Var5 = p_Var3, this_01 < *(cmTarget **)(p_Var3 + 1))) {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      local_70 = &local_60;
      local_68 = 0;
      local_60 = local_60 & 0xffffffffffffff00;
      (*this->_vptr_cmExportFileGenerator[4])(this,&local_70,missingTargets,this_00,target,this_01);
      if (local_68 != 0) {
        std::__cxx11::string::_M_assign((string *)input);
      }
      local_50.field_2._M_allocated_capacity = local_60;
      local_50._M_dataplus._M_p = (pointer)local_70;
      if (local_70 == &local_60) goto LAB_0036c969;
    }
    else {
      cmTarget::GetExportName_abi_cxx11_(&local_50,this_01);
      plVar2 = (long *)std::__cxx11::string::replace
                                 ((ulong)&local_50,0,(char *)0x0,
                                  (ulong)(this->Namespace)._M_dataplus._M_p);
      puVar4 = (ulong *)(plVar2 + 2);
      if ((ulong *)*plVar2 == puVar4) {
        local_60 = *puVar4;
        lStack_58 = plVar2[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *puVar4;
        local_70 = (ulong *)*plVar2;
      }
      local_68 = plVar2[1];
      *plVar2 = (long)puVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::__cxx11::string::operator=((string *)input,(string *)&local_70);
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) goto LAB_0036c969;
    }
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
LAB_0036c969:
  return this_01 != (cmTarget *)0x0;
}

Assistant:

bool
cmExportFileGenerator::AddTargetNamespace(std::string &input,
                                    cmTarget* target,
                                    std::vector<std::string> &missingTargets)
{
  cmMakefile *mf = target->GetMakefile();

  cmTarget *tgt = mf->FindTargetToUse(input);
  if (!tgt)
    {
    return false;
    }

  if(tgt->IsImported())
    {
    return true;
    }
  if(this->ExportedTargets.find(tgt) != this->ExportedTargets.end())
    {
    input = this->Namespace + tgt->GetExportName();
    }
  else
    {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, missingTargets,
                              mf, target, tgt);
    if (!namespacedTarget.empty())
      {
      input = namespacedTarget;
      }
    }
  return true;
}